

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabSet.cpp
# Opt level: O2

FabSet * __thiscall amrex::FabSet::copyFrom(FabSet *this,FabSet *src,int scomp,int dcomp,int ncomp)

{
  bool bVar1;
  Periodicity *period;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  Array4<double> dstfab;
  Array4<const_double> srcfab;
  FabSetIter fsi;
  long local_198;
  long local_190;
  Box local_12c;
  Array4<double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  bVar1 = BoxArray::operator==
                    (&(this->m_mf).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray,
                     &(src->m_mf).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray);
  if ((bVar1) &&
     (bVar1 = DistributionMapping::operator==
                        (&(this->m_mf).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                          distributionMap,
                         &(src->m_mf).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                          distributionMap), bVar1)) {
    FabSetIter::FabSetIter((FabSetIter *)&local_90,this);
    if (ncomp < 1) {
      ncomp = 0;
    }
    while (local_90.currentIndex < local_90.endIndex) {
      MFIter::validbox(&local_12c,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,(FabArray<amrex::FArrayBox> *)src,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_110,(FabArray<amrex::FArrayBox> *)this,&local_90);
      lVar2 = (long)local_12c.smallend.vect[1];
      local_198 = (long)scomp << 3;
      local_190 = (long)dcomp << 3;
      for (uVar3 = 0; lVar6 = (long)local_12c.smallend.vect[2], uVar3 != (uint)ncomp;
          uVar3 = uVar3 + 1) {
        for (; (int)lVar6 <= local_12c.bigend.vect[2]; lVar6 = lVar6 + 1) {
          lVar7 = (long)local_d0.p +
                  local_d0.nstride * local_198 +
                  (lVar2 - local_d0.begin.y) * local_d0.jstride * 8 +
                  (lVar6 - local_d0.begin.z) * local_d0.kstride * 8 + (long)local_d0.begin.x * -8 +
                  (long)local_12c.smallend.vect[0] * 8;
          lVar8 = (long)local_110.p +
                  local_110.nstride * local_190 +
                  (lVar2 - local_110.begin.y) * local_110.jstride * 8 +
                  (lVar6 - local_110.begin.z) * local_110.kstride * 8 + (long)local_110.begin.x * -8
                  + (long)local_12c.smallend.vect[0] * 8;
          for (lVar4 = lVar2; lVar4 <= local_12c.bigend.vect[1]; lVar4 = lVar4 + 1) {
            if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
              lVar5 = 0;
              do {
                *(undefined8 *)(lVar8 + lVar5 * 8) = *(undefined8 *)(lVar7 + lVar5 * 8);
                lVar5 = lVar5 + 1;
              } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 != (int)lVar5);
            }
            lVar7 = lVar7 + local_d0.jstride * 8;
            lVar8 = lVar8 + local_110.jstride * 8;
          }
        }
        local_198 = local_198 + 8;
        local_190 = local_190 + 8;
      }
      MFIter::operator++(&local_90);
    }
    MFIter::~MFIter(&local_90);
    return this;
  }
  period = Periodicity::NonPeriodic();
  FabArray<amrex::FArrayBox>::ParallelCopy
            ((FabArray<amrex::FArrayBox> *)this,(FabArray<amrex::FArrayBox> *)src,scomp,dcomp,ncomp,
             period,COPY);
  return this;
}

Assistant:

FabSet&
FabSet::copyFrom (const FabSet& src, int scomp, int dcomp, int ncomp)
{
    if (boxArray() == src.boxArray() && DistributionMap() == src.DistributionMap()) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (FabSetIter fsi(*this); fsi.isValid(); ++fsi) {
            const Box& bx = fsi.validbox();
            auto const srcfab =   src.array(fsi);
            auto       dstfab = this->array(fsi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                dstfab(i,j,k,n+dcomp) = srcfab(i,j,k,n+scomp);
            });
        }
    } else {
        m_mf.ParallelCopy(src.m_mf,scomp,dcomp,ncomp);
    }
    return *this;
}